

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
cs::method_namespace::postprocess(method_namespace *this,context_t *context,domain_type *domain)

{
  any *in_RSI;
  var *in_stack_00000050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000058;
  domain_manager *in_stack_00000060;
  domain_type *in_stack_ffffffffffffff68;
  allocator local_39;
  string *in_stack_ffffffffffffffc8;
  domain_type *in_stack_ffffffffffffffd0;
  
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x56343c);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x563448);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc8,"__PRAGMA_CS_NAMESPACE_DEFINITION__",&local_39);
  domain_type::get_var(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  cs_impl::any::const_val<std::__cxx11::string>(in_RSI);
  make_shared_namespace<cs::name_space,cs::domain_type_const&>(in_stack_ffffffffffffff68);
  make_namespace((namespace_t *)in_stack_ffffffffffffff68);
  domain_manager::add_var_no_return<std::__cxx11::string_const&>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050);
  cs_impl::any::~any((any *)0x5634f1);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x5634fb);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void method_namespace::postprocess(const context_t &context, const domain_type &domain)
	{
		context->instance->storage.add_var_no_return(domain.get_var("__PRAGMA_CS_NAMESPACE_DEFINITION__").const_val<string>(),
		        make_namespace(make_shared_namespace<name_space>(domain)));
	}